

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic-ops.h
# Opt level: O1

void uv__async_close(uv_async_t *handle)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  
  LOCK();
  iVar3 = handle->pending;
  if (iVar3 == 2) {
    handle->pending = 0;
    iVar3 = 2;
  }
  UNLOCK();
  while (iVar3 == 1) {
    LOCK();
    iVar3 = handle->pending;
    if (iVar3 == 2) {
      handle->pending = 0;
      iVar3 = 2;
    }
    UNLOCK();
  }
  *(void **)handle->queue[1] = handle->queue[0];
  *(void **)((long)handle->queue[0] + 8) = handle->queue[1];
  uVar2 = handle->flags;
  if (((uVar2 & 4) != 0) && (handle->flags = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  return;
}

Assistant:

UV_UNUSED(static int cmpxchgi(int* ptr, int oldval, int newval)) {
#if defined(__i386__) || defined(__x86_64__)
  int out;
  __asm__ __volatile__ ("lock; cmpxchg %2, %1;"
                        : "=a" (out), "+m" (*(volatile int*) ptr)
                        : "r" (newval), "0" (oldval)
                        : "memory");
  return out;
#elif defined(_AIX) && defined(__xlC__)
  const int out = (*(volatile int*) ptr);
  __compare_and_swap(ptr, &oldval, newval);
  return out;
#elif defined(__MVS__)
  unsigned int op4;
  if (__plo_CSST(ptr, (unsigned int*) &oldval, newval,
                (unsigned int*) ptr, *ptr, &op4))
    return oldval;
  else
    return op4;
#elif defined(__SUNPRO_C) || defined(__SUNPRO_CC)
  return atomic_cas_uint((uint_t *)ptr, (uint_t)oldval, (uint_t)newval);
#else
  return __sync_val_compare_and_swap(ptr, oldval, newval);
#endif
}